

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  xmlDocPtr pxVar3;
  int iVar4;
  int iVar5;
  xmlRelaxNGValidStatePtr pxVar6;
  xmlNodePtr pxVar7;
  xmlRelaxNGStatesPtr pxVar8;
  xmlDocPtr pxVar9;
  long lVar10;
  bool bVar11;
  xmlValidCtxt local_a8;
  
  if (doc == (xmlDocPtr)0x0 || ctxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return -1;
  }
  ctxt->doc = doc;
  iVar4 = -1;
  if (ctxt->schema == (xmlRelaxNGPtr)0x0) goto LAB_0016db3e;
  ctxt->errNo = 0;
  pxVar2 = ctxt->schema->topgrammar;
  if (pxVar2 == (xmlRelaxNGGrammarPtr_conflict)0x0) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_NOGRAMMAR,(xmlChar *)0x0,(xmlChar *)0x0,0);
    goto LAB_0016db3e;
  }
  pxVar6 = xmlRelaxNGNewValidState(ctxt,(xmlNodePtr)0x0);
  ctxt->state = pxVar6;
  iVar4 = xmlRelaxNGValidateDefinition(ctxt,pxVar2->start);
  if ((ctxt->state == (xmlRelaxNGValidStatePtr)0x0) || (pxVar6->seq == (xmlNodePtr)0x0)) {
    pxVar8 = ctxt->states;
    if (pxVar8 != (xmlRelaxNGStatesPtr)0x0) {
      iVar5 = -1;
      for (lVar10 = 0; lVar10 < pxVar8->nbState; lVar10 = lVar10 + 1) {
        pxVar6 = pxVar8->tabState[lVar10];
        pxVar7 = xmlRelaxNGSkipIgnored(ctxt,pxVar6->seq);
        if (pxVar7 == (xmlNodePtr)0x0) {
          iVar5 = 0;
        }
        xmlRelaxNGFreeValidState(ctxt,pxVar6);
        pxVar8 = ctxt->states;
      }
      if (iVar5 == -1) goto LAB_0016da8d;
    }
  }
  else {
    pxVar7 = xmlRelaxNGSkipIgnored(ctxt,ctxt->state->seq);
    if (pxVar7 != (xmlNodePtr)0x0) {
LAB_0016da8d:
      if (iVar4 != -1) {
        xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_EXTRADATA,(xmlChar *)0x0,(xmlChar *)0x0,0);
        iVar4 = -1;
      }
    }
  }
  if (ctxt->state != (xmlRelaxNGValidStatePtr)0x0) {
    xmlRelaxNGFreeValidState(ctxt,ctxt->state);
    ctxt->state = (xmlRelaxNGValidStatePtr)0x0;
  }
  if (iVar4 == 0) {
    if (ctxt->idref == 1) goto LAB_0016dadc;
  }
  else {
    xmlRelaxNGDumpValidError(ctxt);
    if (ctxt->idref != 1) goto LAB_0016db3e;
LAB_0016dadc:
    bVar11 = iVar4 != 0;
    local_a8.doc = (xmlDocPtr)0x0;
    local_a8.vstateTab = (xmlValidState *)0x0;
    local_a8.am = (xmlAutomataPtr)0x0;
    local_a8.vstate = (xmlValidState *)0x0;
    local_a8.vstateNr = 0;
    local_a8.vstateMax = 0;
    local_a8.nodeTab = (xmlNodePtr *)0x0;
    local_a8.flags = 0;
    local_a8._52_4_ = 0;
    local_a8.node = (xmlNodePtr)0x0;
    local_a8.nodeNr = 0;
    local_a8.nodeMax = 0;
    local_a8.state = (xmlAutomataStatePtr)0x0;
    local_a8.valid = 1;
    local_a8._68_4_ = 0;
    local_a8.warning = ctxt->warning;
    local_a8.userData = ctxt->userData;
    local_a8.error = ctxt->error;
    iVar5 = xmlValidateDocumentFinal(&local_a8,doc);
    if (iVar5 != 1) {
      iVar4 = -1;
    }
    if (iVar5 != 1 || bVar11) goto LAB_0016db3e;
  }
  iVar4 = -(uint)(ctxt->errNo != 0);
LAB_0016db3e:
  xVar1 = doc->type;
  if ((xVar1 != XML_HTML_DOCUMENT_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
    if (xVar1 != XML_ELEMENT_NODE) {
LAB_0016db97:
      iVar5 = 1;
      if (iVar4 != -1) {
        iVar5 = iVar4;
      }
      return iVar5;
    }
    doc->version = (xmlChar *)0x0;
  }
  pxVar3 = (xmlDocPtr)doc->children;
LAB_0016db59:
  pxVar9 = pxVar3;
  if (pxVar9 != (xmlDocPtr)0x0) {
    if (pxVar9->type == XML_ELEMENT_NODE) goto code_r0x0016db67;
    goto LAB_0016db75;
  }
  goto LAB_0016db97;
code_r0x0016db67:
  pxVar9->version = (xmlChar *)0x0;
  pxVar3 = (xmlDocPtr)pxVar9->children;
  if ((xmlDocPtr)pxVar9->children == (xmlDocPtr)0x0) {
LAB_0016db75:
    do {
      pxVar3 = (xmlDocPtr)pxVar9->next;
      if ((xmlDocPtr)pxVar9->next != (xmlDocPtr)0x0) break;
      pxVar9 = (xmlDocPtr)pxVar9->parent;
      if (pxVar9 == (xmlDocPtr)0x0) {
        pxVar3 = (xmlDocPtr)0x0;
        break;
      }
      pxVar3 = (xmlDocPtr)0x0;
    } while (pxVar9 != doc);
  }
  goto LAB_0016db59;
}

Assistant:

int
xmlRelaxNGValidateDoc(xmlRelaxNGValidCtxtPtr ctxt, xmlDocPtr doc)
{
    int ret;

    if ((ctxt == NULL) || (doc == NULL))
        return (-1);

    ctxt->doc = doc;

    ret = xmlRelaxNGValidateDocument(ctxt, doc);
    /*
     * Remove all left PSVI
     */
    xmlRelaxNGCleanPSVI((xmlNodePtr) doc);

    /*
     * TODO: build error codes
     */
    if (ret == -1)
        return (1);
    return (ret);
}